

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

ssize_t inbound_frame_effective_readlen
                  (nghttp2_inbound_frame *iframe,size_t payloadleft,size_t readlen)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar1 = nghttp2_frame_trail_padlen(&iframe->frame,iframe->padlen);
  sVar2 = 0xffffffffffffffff;
  if (sVar1 - payloadleft <= readlen) {
    sVar2 = readlen - (sVar1 - payloadleft);
  }
  if (sVar1 <= payloadleft) {
    sVar2 = readlen;
  }
  return sVar2;
}

Assistant:

static ssize_t inbound_frame_effective_readlen(nghttp2_inbound_frame *iframe,
                                               size_t payloadleft,
                                               size_t readlen) {
  size_t trail_padlen =
      nghttp2_frame_trail_padlen(&iframe->frame, iframe->padlen);

  if (trail_padlen > payloadleft) {
    size_t padlen;
    padlen = trail_padlen - payloadleft;
    if (readlen < padlen) {
      return -1;
    }
    return (ssize_t)(readlen - padlen);
  }
  return (ssize_t)(readlen);
}